

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.cpp
# Opt level: O2

BinOpr subexpr(LexState *ls,expdesc *v,uint limit)

{
  unsigned_short *puVar1;
  FuncState *fs;
  int iVar2;
  BinOpr BVar3;
  Proto *pPVar4;
  byte bVar5;
  UnOpr op;
  BinOpr op_00;
  expdesc v2;
  
  enterlevel(ls);
  iVar2 = (ls->t).token;
  switch(iVar2) {
  case 0x107:
    v->t = -1;
    v->f = -1;
    v->k = VFALSE;
    goto LAB_00110235;
  case 0x108:
  case 0x10a:
  case 0x10b:
  case 0x10c:
switchD_001101c9_caseD_108:
    primaryexp(ls,v);
    break;
  case 0x109:
    luaX_next(ls);
    body(ls,v,0,ls->linenumber);
    break;
  case 0x10d:
    v->t = -1;
    v->f = -1;
    v->k = VNIL;
LAB_00110235:
    (v->u).s.info = 0;
LAB_001102e9:
    luaX_next(ls);
    break;
  case 0x10e:
    op = OPR_NOT;
LAB_00110242:
    luaX_next(ls);
    subexpr(ls,v,8);
    luaK_prefix(ls->fs,op,v);
    break;
  default:
    if (iVar2 == 0x23) {
      op = OPR_LEN;
      goto LAB_00110242;
    }
    if (iVar2 == 0x11e) {
      codestring(ls,v,(ls->t).seminfo.ts);
    }
    else {
      if (iVar2 == 0x7b) {
        constructor(ls,v);
        break;
      }
      if (iVar2 == 0x113) {
        v->t = -1;
        v->f = -1;
        v->k = VTRUE;
        goto LAB_00110235;
      }
      if (iVar2 == 0x117) {
        fs = ls->fs;
        pPVar4 = fs->f;
        bVar5 = pPVar4->is_vararg;
        if (bVar5 == 0) {
          luaX_syntaxerror(ls,"cannot use \'...\' outside a vararg function");
          pPVar4 = fs->f;
          bVar5 = pPVar4->is_vararg;
        }
        pPVar4->is_vararg = bVar5 & 0xfb;
        iVar2 = luaK_codeABC(fs,OP_VARARG,0,1,0);
        v->t = -1;
        v->f = -1;
        v->k = VVARARG;
        (v->u).s.info = iVar2;
      }
      else {
        if (iVar2 != 0x11c) {
          if (iVar2 != 0x2d) goto switchD_001101c9_caseD_108;
          op = OPR_MINUS;
          goto LAB_00110242;
        }
        v->t = -1;
        v->f = -1;
        v->k = VKNUM;
        (v->u).s.info = 0;
        v->u = (anon_union_8_2_fd02c123_for_u)(ls->t).seminfo;
      }
    }
    goto LAB_001102e9;
  }
  iVar2 = (ls->t).token;
  switch(iVar2) {
  case 0x10f:
    op_00 = OPR_OR;
    break;
  case 0x110:
  case 0x111:
  case 0x112:
  case 0x113:
  case 0x114:
  case 0x115:
  case 0x117:
    goto switchD_00110316_caseD_26;
  case 0x116:
    op_00 = OPR_CONCAT;
    break;
  case 0x118:
    op_00 = OPR_EQ;
    break;
  case 0x119:
    op_00 = OPR_GE;
    break;
  case 0x11a:
    op_00 = OPR_LE;
    break;
  case 0x11b:
    op_00 = OPR_NE;
    break;
  default:
    switch(iVar2) {
    case 0x25:
      op_00 = OPR_MOD;
      break;
    case 0x2a:
      op_00 = OPR_MUL;
      break;
    case 0x2b:
      op_00 = OPR_ADD;
      break;
    case 0x2d:
      op_00 = OPR_SUB;
      break;
    case 0x2f:
      op_00 = OPR_DIV;
      break;
    default:
      if (iVar2 == 0x3c) {
        op_00 = OPR_LT;
        break;
      }
      if (iVar2 == 0x3e) {
        op_00 = OPR_GT;
        break;
      }
      if (iVar2 == 0x5e) {
        op_00 = OPR_POW;
        break;
      }
      if (iVar2 == 0x101) {
        op_00 = OPR_AND;
        break;
      }
    case 0x26:
    case 0x27:
    case 0x28:
    case 0x29:
    case 0x2c:
    case 0x2e:
switchD_00110316_caseD_26:
      op_00 = OPR_NOBINOPR;
    }
  }
  while ((op_00 != OPR_NOBINOPR && (limit < priority[op_00].left))) {
    luaX_next(ls);
    luaK_infix(ls->fs,op_00,v);
    BVar3 = subexpr(ls,&v2,(uint)priority[op_00].right);
    luaK_posfix(ls->fs,op_00,v,&v2);
    op_00 = BVar3;
  }
  puVar1 = &ls->L->nCcalls;
  *puVar1 = *puVar1 - 1;
  return op_00;
}

Assistant:

static BinOpr subexpr (LexState *ls, expdesc *v, unsigned int limit) {
  BinOpr op;
  UnOpr uop;
  enterlevel(ls);
  uop = getunopr(ls->t.token);
  if (uop != OPR_NOUNOPR) {
    luaX_next(ls);
    subexpr(ls, v, UNARY_PRIORITY);
    luaK_prefix(ls->fs, uop, v);
  }
  else simpleexp(ls, v);
  /* expand while operators have priorities higher than `limit' */
  op = getbinopr(ls->t.token);
  while (op != OPR_NOBINOPR && priority[op].left > limit) {
    expdesc v2;
    BinOpr nextop;
    luaX_next(ls);
    luaK_infix(ls->fs, op, v);
    /* read sub-expression with higher priority */
    nextop = subexpr(ls, &v2, priority[op].right);
    luaK_posfix(ls->fs, op, v, &v2);
    op = nextop;
  }
  leavelevel(ls);
  return op;  /* return first untreated operator */
}